

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this,uint c)

{
  cmLocalGenerator *lg;
  bool bVar1;
  TargetType TVar2;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  cmMakefile *this_02;
  cmCompiledGeneratorExpression *this_03;
  char *pcVar3;
  byte local_b1;
  byte local_92;
  allocator local_91;
  string local_90;
  undefined1 local_70 [11];
  byte local_65;
  undefined1 local_52;
  allocator local_51;
  string local_50;
  cmGeneratorTarget *local_30;
  cmGeneratorTarget *target;
  string *argv0;
  cmCustomCommandGenerator *pcStack_18;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  argv0._4_4_ = c;
  pcStack_18 = this;
  this_local = (cmCustomCommandGenerator *)__return_storage_ptr__;
  this_00 = &cmCustomCommand::GetCommandLines(this->CC)->
             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  this_01 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (this_00,(ulong)argv0._4_4_)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  target = (cmGeneratorTarget *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](this_01,0);
  local_30 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,(string *)target);
  local_52 = 0;
  local_65 = 0;
  local_92 = 0;
  if (local_30 != (cmGeneratorTarget *)0x0) {
    TVar2 = cmGeneratorTarget::GetType(local_30);
    local_92 = 0;
    if (TVar2 == EXECUTABLE) {
      bVar1 = cmGeneratorTarget::IsImported(local_30);
      local_b1 = 1;
      if (!bVar1) {
        this_02 = cmLocalGenerator::GetMakefile(this->LG);
        std::allocator<char>::allocator();
        local_52 = 1;
        std::__cxx11::string::string((string *)&local_50,"CMAKE_CROSSCOMPILING",&local_51);
        local_65 = 1;
        bVar1 = cmMakefile::IsOn(this_02,&local_50);
        local_b1 = bVar1 ^ 0xff;
      }
      local_92 = local_b1;
    }
  }
  if ((local_65 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  if ((local_92 & 1) == 0) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_70,(string *)this->GE);
    this_03 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
    lg = this->LG;
    std::__cxx11::string::string((string *)&local_90);
    pcVar3 = cmCompiledGeneratorExpression::Evaluate
                       (this_03,lg,&this->Config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string((string *)&local_90);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_70);
  }
  else {
    pcVar3 = cmGeneratorTarget::GetLocation(local_30,&this->Config);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar3,(allocator *)(local_70 + 10));
    std::allocator<char>::~allocator((allocator<char> *)(local_70 + 10));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetCommand(unsigned int c) const
{
  std::string const& argv0 = this->CC.GetCommandLines()[c][0];
  cmGeneratorTarget* target =
      this->LG->FindGeneratorTargetToUse(argv0);
  if(target && target->GetType() == cmState::EXECUTABLE &&
     (target->IsImported()
      || !this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")))
    {
    return target->GetLocation(this->Config);
    }
  return this->GE->Parse(argv0)->Evaluate(this->LG, this->Config);
}